

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::SubDataToUndefinedCase::iterate(SubDataToUndefinedCase *this)

{
  pointer pVVar1;
  pointer pVVar2;
  deUint32 buffer;
  uint uVar3;
  int iVar4;
  char *description;
  byte bVar5;
  IVec2 *newRange;
  size_t in_R9;
  pointer pVVar6;
  pointer pVVar7;
  pointer pVVar8;
  BufferVerifier verifier;
  ReferenceBuffer refBuf;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> definedRanges;
  pointer local_b0;
  BufferVerifier local_a0;
  deUint32 local_94;
  CallLogWrapper *local_90;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> local_88;
  ReferenceBuffer local_68;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> local_48;
  
  local_94 = deStringHash((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.
                          m_name._M_dataplus._M_p);
  BufferTestUtil::BufferVerifier::BufferVerifier
            (&local_a0,(this->super_BufferCase).super_TestCase.m_context,this->m_verify);
  local_68.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_68.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  BufferTestUtil::ReferenceBuffer::setSize(&local_68,this->m_size);
  buffer = BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  local_90 = &(this->super_BufferCase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(local_90,this->m_target,buffer);
  glu::CallLogWrapper::glBufferData
            (local_90,this->m_target,(long)this->m_size,(void *)0x0,this->m_usage);
  BufferTestUtil::BufferCase::checkError(&this->super_BufferCase);
  newRange = (this->m_ranges).
             super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
             super__Vector_impl_data._M_start;
  bVar5 = 1;
  if (newRange ==
      (this->m_ranges).
      super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pVVar7 = (pointer)0x0;
    pVVar8 = (pointer)0x0;
  }
  else {
    local_b0 = (pointer)0x0;
    pVVar6 = (pointer)0x0;
    do {
      pVVar1 = local_b0;
      uVar3 = newRange->m_data[1] + newRange->m_data[0];
      uVar3 = (uVar3 >> 0x10 ^ uVar3 ^ 0x3d) * 9;
      uVar3 = (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
      BufferTestUtil::fillWithRandomBytes
                (local_68.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + newRange->m_data[0],newRange->m_data[1],
                 uVar3 >> 0xf ^ local_94 ^ uVar3);
      glu::CallLogWrapper::glBufferSubData
                (local_90,this->m_target,(long)newRange->m_data[0],(long)newRange->m_data[1],
                 local_68.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + newRange->m_data[0]);
      addRangeToList(&local_88,&local_48,newRange);
      pVVar8 = local_88.
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      pVVar2 = local_88.
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pVVar7 = local_88.
               super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_48.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_88.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_48.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_b0 = local_88.
                 super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_88.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_88.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pVVar6 != (pointer)0x0) &&
         (operator_delete(pVVar6,(long)pVVar1 - (long)pVVar6),
         local_88.super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
         _M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_88.
                        super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      newRange = newRange + 1;
      pVVar6 = pVVar7;
    } while (newRange !=
             (this->m_ranges).
             super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (pVVar7 == pVVar2) {
      bVar5 = 1;
    }
    else {
      bVar5 = 1;
      do {
        iVar4 = BufferTestUtil::BufferVerifier::verify
                          (&local_a0,(EVP_PKEY_CTX *)(ulong)buffer,
                           local_68.m_data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,(ulong)(uint)pVVar6->m_data[0],
                           (uchar *)(ulong)(uint)pVVar6->m_data[1],in_R9);
        bVar5 = bVar5 & (byte)iVar4;
        pVVar6 = pVVar6 + 1;
      } while (pVVar6 != pVVar2);
    }
  }
  BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,buffer);
  description = "Buffer verification failed";
  if (bVar5 != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (uint)(bVar5 ^ 1),description);
  if (pVVar7 != (pointer)0x0) {
    operator_delete(pVVar7,(long)pVVar8 - (long)pVVar7);
  }
  if (local_68.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_68.m_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  BufferTestUtil::BufferVerifier::~BufferVerifier(&local_a0);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32			dataSeed	= deStringHash(getName());
		BufferVerifier			verifier	(m_context, m_verify);
		ReferenceBuffer			refBuf;
		bool					isOk		= true;
		std::vector<tcu::IVec2>	definedRanges;

		refBuf.setSize(m_size);

		deUint32 buf = genBuffer();
		glBindBuffer(m_target, buf);

		// Initialize storage with glBufferData()
		glBufferData(m_target, m_size, DE_NULL, m_usage);
		checkError();

		// Fill specified ranges with glBufferSubData()
		for (vector<tcu::IVec2>::const_iterator range = m_ranges.begin(); range != m_ranges.end(); range++)
		{
			fillWithRandomBytes(refBuf.getPtr()+range->x(), range->y(), dataSeed ^ deInt32Hash(range->x()+range->y()));
			glBufferSubData(m_target, range->x(), range->y(), refBuf.getPtr()+range->x());

			// Mark range as defined
			definedRanges = addRangeToList(definedRanges, *range);
		}

		// Verify defined parts
		for (vector<tcu::IVec2>::const_iterator range = definedRanges.begin(); range != definedRanges.end(); range++)
		{
			if (!verifier.verify(buf, refBuf.getPtr(), range->x(), range->y()))
				isOk = false;
		}

		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}